

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O2

void __thiscall
UnifiedRegex::CharSet<unsigned_int>::CloneSurrogateCodeUnitsTo
          (CharSet<unsigned_int> *this,ArenaAllocator *allocator,CharSet<char16_t> *other)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  
  uVar3 = CharSet<char16_t>::Count(this->characterPlanes);
  if (uVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x291,"(this->SimpleCharCount() > 0)","this->SimpleCharCount() > 0");
    if (!bVar2) goto LAB_00d394f7;
    *puVar4 = 0;
  }
  bVar2 = ContainSurrogateCodeUnits(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x292,"(this->ContainSurrogateCodeUnits())",
                       "This doesn\'t contain surrogate code units, will not produce any result.");
    if (!bVar2) {
LAB_00d394f7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  CharSet<char16_t>::CloneSurrogateCodeUnitsTo(this->characterPlanes,allocator,other);
  return;
}

Assistant:

inline void CloneSurrogateCodeUnitsTo(ArenaAllocator* allocator, CharSet<char16>& other)
        {
            Assert(this->SimpleCharCount() > 0);
            AssertMsg(this->ContainSurrogateCodeUnits(), "This doesn't contain surrogate code units, will not produce any result.");
            this->characterPlanes[0].CloneSurrogateCodeUnitsTo(allocator, other);
        }